

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O2

void Dau_DecVarReplace(char *pStr,int *pPerm,int nVars)

{
  byte bVar1;
  
  do {
    if (*pStr == '\0') {
      return;
    }
    bVar1 = *pStr + 0x9f;
    if (bVar1 < 0x1a) {
      if (nVars <= (int)(uint)bVar1) {
        __assert_fail("pStr[v] - \'a\' < nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                      ,0x233,"void Dau_DecVarReplace(char *, int *, int)");
      }
      *pStr = (char)pPerm[bVar1] + 'a';
    }
    pStr = pStr + 1;
  } while( true );
}

Assistant:

void Dau_DecVarReplace( char * pStr, int * pPerm, int nVars )
{
    int v;
    for ( v = 0; pStr[v]; v++ )
        if ( pStr[v] >= 'a' && pStr[v] <= 'z' )
        {
            assert( pStr[v] - 'a' < nVars );
            pStr[v] = 'a' + pPerm[pStr[v] - 'a'];
        }
}